

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_opt_getNextMatchAndUpdateSeqStore
               (ZSTD_optLdm_t *optLdm,U32 currPosInBlock,U32 blockBytesRemaining)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  rawSeq *prVar4;
  U32 local_38;
  uint local_34;
  U32 matchBytesRemaining;
  U32 literalsBytesRemaining;
  U32 currBlockEndPos;
  rawSeq currSeq;
  U32 blockBytesRemaining_local;
  U32 currPosInBlock_local;
  ZSTD_optLdm_t *optLdm_local;
  
  if (((optLdm->seqStore).size == 0) || ((optLdm->seqStore).size <= (optLdm->seqStore).pos)) {
    optLdm->startPosInBlock = 0xffffffff;
    optLdm->endPosInBlock = 0xffffffff;
  }
  else {
    prVar4 = (optLdm->seqStore).seq + (optLdm->seqStore).pos;
    uVar1 = prVar4->offset;
    uVar2 = prVar4->litLength;
    local_38 = prVar4->matchLength;
    if ((ulong)(uVar2 + local_38) < (optLdm->seqStore).posInSequence) {
      __assert_fail("optLdm->seqStore.posInSequence <= currSeq.litLength + currSeq.matchLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x3b1,"void ZSTD_opt_getNextMatchAndUpdateSeqStore(ZSTD_optLdm_t *, U32, U32)")
      ;
    }
    uVar3 = currPosInBlock + blockBytesRemaining;
    if ((optLdm->seqStore).posInSequence < (ulong)(uint)uVar2) {
      local_34 = uVar2 - (int)(optLdm->seqStore).posInSequence;
    }
    else {
      local_34 = 0;
    }
    if (local_34 == 0) {
      local_38 = local_38 - ((int)(optLdm->seqStore).posInSequence - uVar2);
    }
    if (local_34 < blockBytesRemaining) {
      optLdm->startPosInBlock = currPosInBlock + local_34;
      optLdm->endPosInBlock = optLdm->startPosInBlock + local_38;
      optLdm->offset = uVar1;
      if (uVar3 < optLdm->endPosInBlock) {
        optLdm->endPosInBlock = uVar3;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore,(ulong)(uVar3 - currPosInBlock));
      }
      else {
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore,(ulong)(local_34 + local_38));
      }
    }
    else {
      optLdm->startPosInBlock = 0xffffffff;
      optLdm->endPosInBlock = 0xffffffff;
      ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore,(ulong)blockBytesRemaining);
    }
  }
  return;
}

Assistant:

static void
ZSTD_opt_getNextMatchAndUpdateSeqStore(ZSTD_optLdm_t* optLdm, U32 currPosInBlock,
                                       U32 blockBytesRemaining)
{
    rawSeq currSeq;
    U32 currBlockEndPos;
    U32 literalsBytesRemaining;
    U32 matchBytesRemaining;

    /* Setting match end position to MAX to ensure we never use an LDM during this block */
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        optLdm->startPosInBlock = UINT_MAX;
        optLdm->endPosInBlock = UINT_MAX;
        return;
    }
    /* Calculate appropriate bytes left in matchLength and litLength
     * after adjusting based on ldmSeqStore->posInSequence */
    currSeq = optLdm->seqStore.seq[optLdm->seqStore.pos];
    assert(optLdm->seqStore.posInSequence <= currSeq.litLength + currSeq.matchLength);
    currBlockEndPos = currPosInBlock + blockBytesRemaining;
    literalsBytesRemaining = (optLdm->seqStore.posInSequence < currSeq.litLength) ?
            currSeq.litLength - (U32)optLdm->seqStore.posInSequence :
            0;
    matchBytesRemaining = (literalsBytesRemaining == 0) ?
            currSeq.matchLength - ((U32)optLdm->seqStore.posInSequence - currSeq.litLength) :
            currSeq.matchLength;

    /* If there are more literal bytes than bytes remaining in block, no ldm is possible */
    if (literalsBytesRemaining >= blockBytesRemaining) {
        optLdm->startPosInBlock = UINT_MAX;
        optLdm->endPosInBlock = UINT_MAX;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, blockBytesRemaining);
        return;
    }

    /* Matches may be < MINMATCH by this process. In that case, we will reject them
       when we are deciding whether or not to add the ldm */
    optLdm->startPosInBlock = currPosInBlock + literalsBytesRemaining;
    optLdm->endPosInBlock = optLdm->startPosInBlock + matchBytesRemaining;
    optLdm->offset = currSeq.offset;

    if (optLdm->endPosInBlock > currBlockEndPos) {
        /* Match ends after the block ends, we can't use the whole match */
        optLdm->endPosInBlock = currBlockEndPos;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, currBlockEndPos - currPosInBlock);
    } else {
        /* Consume nb of bytes equal to size of sequence left */
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, literalsBytesRemaining + matchBytesRemaining);
    }
}